

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreeOverwriteCell(BtCursor *pCur,BtreePayload *pX)

{
  ushort uVar1;
  uint uVar2;
  MemPage *pMVar3;
  u8 *pDest;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint iOffset;
  MemPage *pPage;
  Pgno local_44;
  MemPage *local_40;
  BtShared *local_38;
  
  uVar6 = pX->nZero + pX->nData;
  pMVar3 = pCur->pPage;
  pDest = (pCur->info).pPayload;
  uVar1 = (pCur->info).nLocal;
  local_40 = pMVar3;
  if (pMVar3->aDataEnd < pDest + uVar1) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x117e2,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
    iVar4 = 0xb;
  }
  else {
    iVar4 = btreeOverwriteContent(pMVar3,pDest,pX,0,(uint)uVar1);
    if (iVar4 == 0) {
      uVar1 = (pCur->info).nLocal;
      iOffset = (uint)uVar1;
      iVar4 = 0;
      if (uVar6 != uVar1) {
        uVar2 = *(uint *)((pCur->info).pPayload + (uint)uVar1);
        local_44 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        local_38 = pMVar3->pBt;
        iVar4 = local_38->usableSize - 4;
        do {
          iVar5 = btreeGetPage(local_38,local_44,&local_40,0);
          pMVar3 = local_40;
          if (iVar5 != 0) {
            return iVar5;
          }
          if (local_40->pDbPage->nRef == 1) {
            if (iVar4 + iOffset < uVar6) {
              uVar2 = *(uint *)local_40->aData;
              local_44 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                         uVar2 << 0x18;
            }
            else {
              iVar4 = uVar6 - iOffset;
            }
            iVar5 = btreeOverwriteContent(local_40,local_40->aData + 4,pX,iOffset,iVar4);
          }
          else {
            iVar5 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x117f5,
                        "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
          }
          if (pMVar3->pDbPage != (DbPage *)0x0) {
            sqlite3PagerUnrefNotNull(pMVar3->pDbPage);
          }
          if (iVar5 != 0) {
            return iVar5;
          }
          iOffset = iOffset + iVar4;
        } while ((int)iOffset < (int)uVar6);
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int btreeOverwriteCell(BtCursor *pCur, const BtreePayload *pX){
  int iOffset;                        /* Next byte of pX->pData to write */
  int nTotal = pX->nData + pX->nZero; /* Total bytes of to write */
  int rc;                             /* Return code */
  MemPage *pPage = pCur->pPage;       /* Page being written */
  BtShared *pBt;                      /* Btree */
  Pgno ovflPgno;                      /* Next overflow page to write */
  u32 ovflPageSize;                   /* Size to write on overflow page */

  if( pCur->info.pPayload + pCur->info.nLocal > pPage->aDataEnd ){
    return SQLITE_CORRUPT_BKPT;
  }
  /* Overwrite the local portion first */
  rc = btreeOverwriteContent(pPage, pCur->info.pPayload, pX,
                             0, pCur->info.nLocal);
  if( rc ) return rc;
  if( pCur->info.nLocal==nTotal ) return SQLITE_OK;

  /* Now overwrite the overflow pages */
  iOffset = pCur->info.nLocal;
  assert( nTotal>=0 );
  assert( iOffset>=0 );
  ovflPgno = get4byte(pCur->info.pPayload + iOffset);
  pBt = pPage->pBt;
  ovflPageSize = pBt->usableSize - 4;
  do{
    rc = btreeGetPage(pBt, ovflPgno, &pPage, 0);
    if( rc ) return rc;
    if( sqlite3PagerPageRefcount(pPage->pDbPage)!=1 ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      if( iOffset+ovflPageSize<(u32)nTotal ){
        ovflPgno = get4byte(pPage->aData);
      }else{
        ovflPageSize = nTotal - iOffset;
      }
      rc = btreeOverwriteContent(pPage, pPage->aData+4, pX,
                                 iOffset, ovflPageSize);
    }
    sqlite3PagerUnref(pPage->pDbPage);
    if( rc ) return rc;
    iOffset += ovflPageSize;
  }while( iOffset<nTotal );
  return SQLITE_OK;    
}